

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearModel.cpp
# Opt level: O2

Result * __thiscall
CoreML::LinearModel::setWeights
          (Result *__return_storage_ptr__,LinearModel *this,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *weights)

{
  pointer pvVar1;
  pointer pdVar2;
  GLMRegressor *pGVar3;
  GLMRegressor_DoubleArray *this_00;
  pointer pdVar4;
  pointer __x;
  vector<double,_std::allocator<double>_> w;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  pGVar3 = Specification::Model::mutable_glmregressor
                     ((this->super_Model).m_spec.
                      super___shared_ptr<CoreML::Specification::Model,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr);
  pvVar1 = (weights->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (__x = (weights->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start; __x != pvVar1; __x = __x + 1) {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_48,__x);
    this_00 = google::protobuf::RepeatedPtrField<CoreML::Specification::GLMRegressor_DoubleArray>::
              Add(&pGVar3->weights_);
    pdVar2 = local_48._M_impl.super__Vector_impl_data._M_finish;
    for (pdVar4 = local_48._M_impl.super__Vector_impl_data._M_start; pdVar4 != pdVar2;
        pdVar4 = pdVar4 + 1) {
      Specification::GLMRegressor_DoubleArray::add_value(this_00,*pdVar4);
    }
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  }
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Result LinearModel::setWeights(std::vector< std::vector<double>> weights) {
        auto lr = m_spec->mutable_glmregressor();
        for(auto w : weights) {
            Specification::GLMRegressor::DoubleArray* cur_arr = lr->add_weights();
            for(double n : w) {
                cur_arr->add_value(n);
            }
        }
        return Result();
    }